

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_string_char(jit_State *J,RecordFFData *rd)

{
  undefined4 uVar1;
  TRef TVar2;
  TRef TVar3;
  TRef TVar4;
  jit_State *in_RSI;
  GCobj *in_RDI;
  TRef tr_1;
  TRef hdr;
  TRef tr;
  BCReg i;
  TRef k255;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  TRef in_stack_ffffffffffffffa4;
  uint uVar5;
  int32_t in_stack_ffffffffffffffac;
  undefined2 in_stack_ffffffffffffffc0;
  undefined2 in_stack_ffffffffffffffc2;
  undefined2 in_stack_ffffffffffffffc4;
  undefined2 in_stack_ffffffffffffffc6;
  
  TVar2 = lj_ir_kint(in_RSI,in_stack_ffffffffffffffac);
  uVar5 = 0;
  while (*(int *)(*(long *)((long)in_RDI + 0x88) + (ulong)uVar5 * 4) != 0) {
    in_stack_ffffffffffffffa4 =
         lj_opt_narrow_toint((jit_State *)
                             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
    *(undefined2 *)((long)in_RDI + 0xa4) = 0x693;
    *(short *)((long)in_RDI + 0xa0) = (short)in_stack_ffffffffffffffa4;
    *(short *)((long)in_RDI + 0xa2) = (short)TVar2;
    lj_opt_fold((jit_State *)CONCAT44(TVar2,uVar5));
    *(undefined2 *)((long)in_RDI + 0xa4) = 0x5b04;
    *(short *)((long)in_RDI + 0xa0) = (short)in_stack_ffffffffffffffa4;
    *(undefined2 *)((long)in_RDI + 0xa2) = 2;
    TVar3 = lj_opt_fold((jit_State *)CONCAT44(TVar2,uVar5));
    *(TRef *)(*(long *)((long)in_RDI + 0x88) + (ulong)uVar5 * 4) = TVar3;
    uVar5 = uVar5 + 1;
  }
  if (uVar5 < 2) {
    if (uVar5 == 0) {
      TVar2 = lj_ir_kgc((jit_State *)
                        CONCAT26(in_stack_ffffffffffffffc6,
                                 CONCAT24(in_stack_ffffffffffffffc4,
                                          CONCAT22(in_stack_ffffffffffffffc2,
                                                   in_stack_ffffffffffffffc0))),in_RDI,
                        (IRType)((ulong)in_RSI >> 0x20));
      **(TRef **)((long)in_RDI + 0x88) = TVar2;
    }
  }
  else {
    TVar4 = recff_bufhdr((jit_State *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0))
    ;
    uVar5 = 0;
    TVar3 = TVar4;
    while (*(int *)(*(long *)((long)in_RDI + 0x88) + (ulong)uVar5 * 4) != 0) {
      uVar1 = *(undefined4 *)(*(long *)((long)in_RDI + 0x88) + (ulong)uVar5 * 4);
      *(undefined2 *)((long)in_RDI + 0xa4) = 0x5405;
      *(short *)((long)in_RDI + 0xa0) = (short)TVar4;
      *(short *)((long)in_RDI + 0xa2) = (short)uVar1;
      TVar4 = lj_opt_fold((jit_State *)CONCAT44(TVar2,uVar5));
      uVar5 = uVar5 + 1;
    }
    *(undefined2 *)((long)in_RDI + 0xa4) = 0x5504;
    *(short *)((long)in_RDI + 0xa0) = (short)TVar4;
    *(short *)((long)in_RDI + 0xa2) = (short)TVar3;
    TVar2 = lj_opt_fold((jit_State *)CONCAT44(TVar2,uVar5));
    **(TRef **)((long)in_RDI + 0x88) = TVar2;
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_string_char(jit_State *J, RecordFFData *rd)
{
  TRef k255 = lj_ir_kint(J, 255);
  BCReg i;
  for (i = 0; J->base[i] != 0; i++) {  /* Convert char values to strings. */
    TRef tr = lj_opt_narrow_toint(J, J->base[i]);
    emitir(IRTGI(IR_ULE), tr, k255);
    J->base[i] = emitir(IRT(IR_TOSTR, IRT_STR), tr, IRTOSTR_CHAR);
  }
  if (i > 1) {  /* Concatenate the strings, if there's more than one. */
    TRef hdr = recff_bufhdr(J), tr = hdr;
    for (i = 0; J->base[i] != 0; i++)
      tr = emitir(IRT(IR_BUFPUT, IRT_PGC), tr, J->base[i]);
    J->base[0] = emitir(IRT(IR_BUFSTR, IRT_STR), tr, hdr);
  } else if (i == 0) {
    J->base[0] = lj_ir_kstr(J, &J2G(J)->strempty);
  }
  UNUSED(rd);
}